

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  int iVar7;
  ImPoolIdx IVar8;
  ImGuiTableInstanceData *pIVar9;
  ImGuiTableColumn *pIVar10;
  ImGuiTableTempData *pIVar11;
  ImGuiTable *pIVar12;
  float fVar13;
  float fVar14;
  ImGuiTable *unaff_retaddr;
  float decoration_size_1;
  float decoration_size;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  float width_spacings;
  float column_width_request;
  ImGuiTableColumn *column;
  int column_n;
  float auto_fit_width_for_stretched_min;
  float auto_fit_width_for_stretched;
  float auto_fit_width_for_fixed;
  ImDrawListSplitter *splitter;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiTableInstanceData *table_instance;
  ImGuiTableTempData *temp_data;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTable *in_stack_000000e0;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff08;
  ImPoolIdx in_stack_ffffffffffffff0c;
  ImDrawList *in_stack_ffffffffffffff10;
  ImGuiTableColumn *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  ImGuiItemFlags in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float lhs;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float local_a8;
  float fStack_a4;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_70;
  float local_6c;
  float local_68;
  float local_64;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  
  pIVar5 = GImGui;
  pIVar12 = GImGui->CurrentTable;
  if ((pIVar12->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(_decoration_size_1);
  }
  uVar2 = pIVar12->Flags;
  window = pIVar12->InnerWindow;
  pIVar3 = pIVar12->OuterWindow;
  pIVar11 = pIVar12->TempData;
  if ((pIVar12->IsInsideRow & 1U) != 0) {
    TableEndRow(unaff_retaddr);
  }
  if (((((uVar2 & 0x20) != 0) && (pIVar12->HoveredColumnBody != -1)) &&
      (bVar6 = IsAnyItemHovered(), !bVar6)) &&
     (bVar6 = IsMouseReleased((ImGuiMouseButton)((ulong)in_stack_ffffffffffffff10 >> 0x20)), bVar6))
  {
    TableOpenContextMenu(in_stack_ffffffffffffff24);
  }
  pIVar9 = TableGetInstanceData
                     ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0)
  ;
  (window->DC).PrevLineSize = pIVar11->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar11->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar11->HostBackupCursorMaxPos;
  fVar14 = pIVar12->RowPosY2;
  if (window == pIVar3) {
    if ((uVar2 & 0x20000) == 0) {
      fVar13 = ImMax<float>((pIVar12->OuterRect).Max.y,fVar14);
      (pIVar12->InnerRect).Max.y = fVar13;
      (pIVar12->OuterRect).Max.y = fVar13;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar14;
  }
  fVar13 = ImMax<float>((pIVar12->WorkRect).Max.y,(pIVar12->OuterRect).Max.y);
  (pIVar12->WorkRect).Max.y = fVar13;
  fVar13 = ImRect::GetHeight(&pIVar12->OuterRect);
  pIVar9->LastOuterHeight = fVar13;
  if ((pIVar12->Flags & 0x1000000U) != 0) {
    in_stack_ffffffffffffff40 = 0;
    fVar13 = 1.0;
    if ((pIVar12->Flags & 0x400U) == 0) {
      fVar13 = 0.0;
    }
    lhs = (pIVar12->InnerWindow->DC).CursorMaxPos.x;
    in_stack_ffffffffffffff44 = fVar13;
    local_44 = lhs;
    if (pIVar12->RightMostEnabledColumn != -1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                          (&pIVar12->Columns,(int)pIVar12->RightMostEnabledColumn);
      local_44 = ImMax<float>(lhs,(pIVar10->WorkMaxX + pIVar12->CellPaddingX +
                                  pIVar12->OuterPaddingX) - fVar13);
      in_stack_ffffffffffffff3c = lhs;
    }
    if (pIVar12->ResizedColumn != -1) {
      local_44 = ImMax<float>(local_44,pIVar12->ResizeLockMinContentsX2);
    }
    (pIVar12->InnerWindow->DC).CursorMaxPos.x = local_44;
  }
  if ((uVar2 & 0x100000) == 0) {
    ImDrawList::PopClipRect(in_stack_ffffffffffffff10);
  }
  ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff10,
                 (ImVec4 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  (window->ClipRect).Min = local_54;
  (window->ClipRect).Max = local_4c;
  if ((uVar2 & 0x780) != 0) {
    TableDrawBorders(unaff_retaddr);
  }
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff24);
  if ((pIVar12->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(in_stack_000000e0);
  }
  ImDrawListSplitter::Merge
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_64 = 0.0;
  local_68 = 0.0;
  local_6c = 0.0;
  for (local_70 = 0; local_70 < pIVar12->ColumnsCount; local_70 = local_70 + 1) {
    if ((pIVar12->EnabledMaskByIndex & 1L << ((byte)local_70 & 0x3f)) != 0) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&pIVar12->Columns,local_70);
      if (((pIVar10->Flags & 0x10U) == 0) || ((pIVar10->Flags & 0x20U) != 0)) {
        in_stack_ffffffffffffff38 =
             TableGetColumnWidthAuto
                       ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
      }
      else {
        in_stack_ffffffffffffff38 = pIVar10->WidthRequest;
      }
      if ((pIVar10->Flags & 0x10U) == 0) {
        local_68 = in_stack_ffffffffffffff38 + local_68;
      }
      else {
        local_64 = in_stack_ffffffffffffff38 + local_64;
      }
      if (((pIVar10->Flags & 8U) != 0) && ((pIVar10->Flags & 0x20U) != 0)) {
        local_6c = ImMax<float>(local_6c,in_stack_ffffffffffffff38 /
                                         (pIVar10->StretchWeight / pIVar12->ColumnsStretchSumWeights
                                         ));
      }
    }
  }
  local_64 = pIVar12->CellPaddingX * 2.0 * (float)(int)pIVar12->ColumnsEnabledCount +
             pIVar12->OuterPaddingX + pIVar12->OuterPaddingX +
             (pIVar12->CellSpacingX1 + pIVar12->CellSpacingX2) *
             (float)(pIVar12->ColumnsEnabledCount + -1) + local_64;
  fVar13 = ImMax<float>(local_68,local_6c);
  pIVar12->ColumnsAutoFitWidth = local_64 + fVar13;
  if (((pIVar12->Flags & 0x1000000U) == 0) && (window != pIVar3)) {
    (window->Scroll).x = 0.0;
  }
  else if ((pIVar12->LastResizedColumn != -1) &&
          (((pIVar12->ResizedColumn == -1 && ((window->ScrollbarX & 1U) != 0)) &&
           (pIVar12->InstanceInteracted == pIVar12->InstanceCurrent)))) {
    fVar13 = pIVar12->CellPaddingX + pIVar12->CellPaddingX + pIVar12->MinColumnWidth;
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                        (&pIVar12->Columns,(int)pIVar12->LastResizedColumn);
    if ((pIVar12->InnerClipRect).Min.x <= pIVar10->MaxX) {
      pIVar1 = &(pIVar12->InnerClipRect).Max;
      if (pIVar1->x <= pIVar10->MaxX && pIVar10->MaxX != pIVar1->x) {
        SetScrollFromPosX(window,(pIVar10->MaxX - (window->Pos).x) + fVar13,1.0);
      }
    }
    else {
      SetScrollFromPosX(window,(pIVar10->MaxX - (window->Pos).x) - fVar13,1.0);
    }
  }
  if ((pIVar12->ResizedColumn != -1) && (pIVar12->InstanceCurrent == pIVar12->InstanceInteracted)) {
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&pIVar12->Columns,(int)pIVar12->ResizedColumn);
    fVar13 = ImFloor(-pIVar12->CellPaddingX + -pIVar12->CellPaddingX +
                     (((((pIVar5->IO).MousePos.x - (pIVar5->ActiveIdClickOffset).x) + 4.0) -
                      pIVar10->MinX) - pIVar12->CellSpacingX1));
    pIVar12->ResizedColumnNextWidth = fVar13;
  }
  PopID();
  IVar4 = (pIVar3->DC).CursorMaxPos;
  (window->WorkRect).Min = (pIVar11->HostBackupWorkRect).Min;
  (window->WorkRect).Max = (pIVar11->HostBackupWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar11->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = (pIVar11->HostBackupParentWorkRect).Max;
  window->SkipItems = (bool)(pIVar12->HostSkipItems & 1);
  (pIVar3->DC).CursorPos = (pIVar12->OuterRect).Min;
  (pIVar3->DC).ItemWidth = pIVar11->HostBackupItemWidth;
  (pIVar3->DC).ItemWidthStack.Size = pIVar11->HostBackupItemWidthStackSize;
  (pIVar3->DC).ColumnsOffset.x = (pIVar11->HostBackupColumnsOffset).x;
  if (window == pIVar3) {
    ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    ItemSize((ImVec2 *)CONCAT44(local_64,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c);
    ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
            (ImGuiID)local_64,
            (ImRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
            in_stack_ffffffffffffff24);
  }
  else {
    EndChild();
  }
  local_a8 = IVar4.x;
  if ((pIVar12->Flags & 0x10000U) == 0) {
    if (0.0 < (pIVar11->UserOuterSize).x) {
      fVar13 = ImMax<float>(local_a8,(pIVar12->OuterRect).Max.x);
      (pIVar3->DC).CursorMaxPos.x = fVar13;
    }
    else {
      if ((pIVar12->Flags & 0x1000000U) == 0) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = (window->ScrollbarSizes).x;
      }
      fVar13 = ImMax<float>((pIVar3->DC).IdealMaxPos.x,
                            ((pIVar12->OuterRect).Min.x + pIVar12->ColumnsAutoFitWidth + fVar13) -
                            (pIVar11->UserOuterSize).x);
      (pIVar3->DC).IdealMaxPos.x = fVar13;
      fVar13 = ImMin<float>((pIVar12->OuterRect).Max.x,
                            (pIVar12->OuterRect).Min.x + pIVar12->ColumnsAutoFitWidth);
      fVar13 = ImMax<float>(local_a8,fVar13);
      (pIVar3->DC).CursorMaxPos.x = fVar13;
    }
  }
  else {
    fVar13 = ImMax<float>(local_a8,(pIVar12->OuterRect).Min.x + pIVar12->ColumnsAutoFitWidth);
    (pIVar3->DC).CursorMaxPos.x = fVar13;
  }
  fStack_a4 = IVar4.y;
  if (0.0 < (pIVar11->UserOuterSize).y) {
    fVar14 = ImMax<float>(fStack_a4,(pIVar12->OuterRect).Max.y);
    (pIVar3->DC).CursorMaxPos.y = fVar14;
  }
  else {
    if ((pIVar12->Flags & 0x2000000U) == 0) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = (window->ScrollbarSizes).y;
    }
    fVar13 = ImMax<float>((pIVar3->DC).IdealMaxPos.y,(fVar14 + fVar13) - (pIVar11->UserOuterSize).y)
    ;
    (pIVar3->DC).IdealMaxPos.y = fVar13;
    fVar14 = ImMin<float>((pIVar12->OuterRect).Max.y,fVar14);
    fVar14 = ImMax<float>(fStack_a4,fVar14);
    (pIVar3->DC).CursorMaxPos.y = fVar14;
  }
  if ((pIVar12->IsSettingsDirty & 1U) != 0) {
    TableSaveSettings((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  pIVar12->IsInitializing = false;
  iVar7 = pIVar5->TablesTempDataStacked + -1;
  pIVar5->TablesTempDataStacked = iVar7;
  if (iVar7 < 1) {
    pIVar11 = (ImGuiTableTempData *)0x0;
  }
  else {
    pIVar11 = ImVector<ImGuiTableTempData>::operator[]
                        (&pIVar5->TablesTempData,pIVar5->TablesTempDataStacked + -1);
  }
  if (pIVar11 == (ImGuiTableTempData *)0x0) {
    pIVar12 = (ImGuiTable *)0x0;
  }
  else {
    pIVar12 = ImPool<ImGuiTable>::GetByIndex
                        ((ImPool<ImGuiTable> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  pIVar5->CurrentTable = pIVar12;
  if (pIVar5->CurrentTable != (ImGuiTable *)0x0) {
    pIVar5->CurrentTable->TempData = pIVar11;
    pIVar5->CurrentTable->DrawSplitter = &pIVar11->DrawSplitter;
  }
  if (pIVar5->CurrentTable == (ImGuiTable *)0x0) {
    IVar8 = -1;
  }
  else {
    IVar8 = ImPool<ImGuiTable>::GetIndex(&pIVar5->Tables,pIVar5->CurrentTable);
  }
  (pIVar3->DC).CurrentTableIdx = IVar8;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}